

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall soul::heart::IODeclaration::IODeclaration(IODeclaration *this,CodeLocation *l)

{
  SourceCodeText *pSVar1;
  RefCountedPtr<soul::SourceCodeText> local_18;
  char *local_10;
  
  pSVar1 = (l->sourceCode).object;
  local_10 = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_003326f8;
  (this->super_Object).location.sourceCode.object = pSVar1;
  local_18.object = (SourceCodeText *)0x0;
  (this->super_Object).location.location.data = local_10;
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__IODeclaration_003335d0;
  (this->name).name = (string *)0x0;
  this->index = 0;
  (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  (this->annotation).properties._M_t.
  super___uniq_ptr_impl<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_std::default_delete<std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_>_>
  .
  super__Head_base<0UL,_std::vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_>_*,_false>
  ._M_head_impl =
       (vector<soul::Annotation::Property,_std::allocator<soul::Annotation::Property>_> *)0x0;
  (this->annotation).dictionary.super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__StringDictionary_0032c9a0;
  (this->annotation).dictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).dictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).dictionary.strings.
  super__Vector_base<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->annotation).dictionary.nextIndex = 1;
  return;
}

Assistant:

IODeclaration (CodeLocation l) : Object (std::move (l)) {}